

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall
InterpGCTest_Collect_TableCycle_Test::TestBody(InterpGCTest_Collect_TableCycle_Test *this)

{
  Store *store;
  ObjectList *this_00;
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  AssertionResult gtest_ar;
  AssertHelper local_100;
  Index after_new;
  Ptr t2;
  Ptr t1;
  Ptr t3;
  TableType local_a8;
  TableType local_80;
  TableType local_58;
  
  store = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_58.super_ExternType.kind = Table;
  local_58.super_ExternType._12_4_ = 0xffffffef;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002e7b80;
  local_58.limits.initial = 2;
  local_58.limits.max = 0xffffffff;
  local_58.limits.has_max = false;
  local_58.limits.is_shared = false;
  wabt::interp::Table::New(&t1,store,&local_58);
  local_80.super_ExternType.kind = Table;
  local_80.super_ExternType._12_4_ = 0xffffffef;
  local_80.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002e7b80;
  local_80.limits.initial = 2;
  local_80.limits.max = 0xffffffff;
  local_80.limits.has_max = false;
  local_80.limits.is_shared = false;
  wabt::interp::Table::New(&t2,store,&local_80);
  local_a8.super_ExternType.kind = Table;
  local_a8.super_ExternType._12_4_ = 0xffffffef;
  local_a8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002e7b80;
  local_a8.limits.initial = 2;
  local_a8.limits.max = 0xffffffff;
  local_a8.limits.has_max = false;
  local_a8.limits.is_shared = false;
  wabt::interp::Table::New(&t3,store,&local_a8);
  wabt::interp::Table::Set(t1.obj_,store,0,(Ref)((t1.obj_)->super_Extern).super_Object.self_.index);
  wabt::interp::Table::Set(t2.obj_,store,0,(Ref)((t3.obj_)->super_Extern).super_Object.self_.index);
  wabt::interp::Table::Set(t3.obj_,store,0,(Ref)((t2.obj_)->super_Extern).super_Object.self_.index);
  wabt::interp::Table::Set(t3.obj_,store,1,(Ref)((t1.obj_)->super_Extern).super_Object.self_.index);
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_.objects_;
  after_new = wabt::interp::
              FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
              ::count(this_00);
  local_118.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"before_new + 3","after_new",(unsigned_long *)&local_118,
             &after_new);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x25c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t1);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t2);
  wabt::interp::Store::Collect(store);
  local_118.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::interp::
       FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
       ::count(this_00);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"after_new","store_.object_count()",&after_new,
             (unsigned_long *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x262,pcVar1);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t3);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t3);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t2);
  wabt::interp::RefPtr<wabt::interp::Table>::reset(&t1);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::Anyref, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}